

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_8.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementHexaCorot_8::ComputeInternalForces
          (ChElementHexaCorot_8 *this,ChVectorDynamic<> *Fi)

{
  double *pdVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  element_type *peVar5;
  element_type *peVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  ulong uVar14;
  ChVectorDynamic<> *pCVar15;
  int iVar16;
  uint uVar17;
  ulong uVar18;
  char *pcVar19;
  double *pdVar20;
  ActualDstType actualDst;
  ulong uVar21;
  long lVar22;
  uint uVar23;
  pointer psVar24;
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  ChVectorDynamic<> FiK_local;
  ChVectorDynamic<> displ;
  ChMatrixDynamic<> FiR_local;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_f8;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_e8;
  undefined1 local_d8 [40];
  double *local_b0;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pPStack_a8;
  Index local_a0;
  ChMatrix33<double> *local_90;
  ChVectorDynamic<> *local_88;
  ChMatrixDynamic<> *local_80;
  long local_78;
  long local_70;
  ulong local_68;
  long local_60;
  ChMatrixRef local_58;
  
  lVar22 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  iVar16 = (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[4])();
  if (lVar22 != iVar16) {
    __assert_fail("Fi.size() == GetNdofs()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/fea/ChElementHexaCorot_8.cpp"
                  ,0x156,
                  "virtual void chrono::fea::ChElementHexaCorot_8::ComputeInternalForces(ChVectorDynamic<> &)"
                 );
  }
  iVar16 = (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[4])(this);
  local_e8.m_storage.m_data = (double *)0x0;
  local_e8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_e8,(long)iVar16);
  (*(this->super_ChElementHexahedron)._vptr_ChElementHexahedron[0xb])(this,&local_e8);
  if ((this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
      m_storage.m_cols != local_e8.m_storage.m_rows) {
    pcVar19 = 
    "Eigen::Product<Eigen::Matrix<double, -1, -1, 1>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1, 1>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
    ;
LAB_006b1608:
    __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                  ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,pcVar19);
  }
  local_f8.m_storage.m_data = (double *)0x0;
  local_f8.m_storage.m_rows = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
            (&local_f8,
             (this->StiffnessMatrix).
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows,1);
  uVar18 = (this->StiffnessMatrix).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
           m_storage.m_rows;
  if (local_f8.m_storage.m_rows != uVar18) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_f8,uVar18,1);
    uVar18 = local_f8.m_storage.m_rows;
  }
  if (-1 < (long)uVar18) {
    if (uVar18 != 0) {
      memset(local_f8.m_storage.m_data,0,uVar18 << 3);
    }
    local_d8._0_8_ = 0x3ff0000000000000;
    local_80 = &this->StiffnessMatrix;
    Eigen::internal::
    generic_product_impl<Eigen::Matrix<double,-1,-1,1,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,Eigen::DenseShape,Eigen::DenseShape,7>
    ::scaleAndAddTo<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((Matrix<double,__1,_1,_0,__1,_1> *)&local_f8,&this->StiffnessMatrix,
               (Matrix<double,__1,_1,_0,__1,_1> *)&local_e8,(Scalar *)local_d8);
    pdVar1 = local_e8.m_storage.m_data;
    psVar24 = (this->nodes).
              super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_90 = &(this->super_ChElementCorotational).A;
    lVar22 = 0;
    local_78 = local_e8.m_storage.m_rows - 3;
    pdVar20 = local_e8.m_storage.m_data;
    local_88 = Fi;
    do {
      peVar5 = (psVar24->super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      dVar2 = *(double *)&peVar5->field_0x40;
      auVar33._8_8_ = *(undefined8 *)&peVar5->field_0x38;
      auVar33._0_8_ = *(undefined8 *)&peVar5->field_0x38;
      auVar34._8_8_ = *(undefined8 *)&peVar5->field_0x48;
      auVar34._0_8_ = *(undefined8 *)&peVar5->field_0x48;
      auVar30._0_8_ =
           dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[3];
      auVar30._8_8_ =
           dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[4];
      auVar3._8_8_ = 0;
      auVar3._0_8_ = (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[2];
      auVar32._8_8_ = 0;
      auVar32._0_8_ =
           dVar2 * (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[5];
      auVar32 = vfmadd231sd_fma(auVar32,auVar33,auVar3);
      auVar3 = vfmadd231pd_fma(auVar30,auVar33,
                               *(undefined1 (*) [16])
                                (this->super_ChElementCorotational).A.
                                super_Matrix<double,_3,_3,_1,_3,_3>.
                                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                                m_storage.m_data.array);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = (this->super_ChElementCorotational).A.super_Matrix<double,_3,_3,_1,_3,_3>.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                     array[8];
      auVar4 = vfmadd231sd_fma(auVar32,auVar34,auVar4);
      local_d8._0_16_ =
           vfmadd231pd_fma(auVar3,auVar34,
                           *(undefined1 (*) [16])
                            ((this->super_ChElementCorotational).A.
                             super_Matrix<double,_3,_3,_1,_3,_3>.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                             m_data.array + 6));
      local_d8._16_8_ = auVar4._0_8_;
      if (local_78 < lVar22) {
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                     );
      }
      uVar23 = 3;
      if (((ulong)pdVar1 & 7) == 0) {
        uVar17 = -((uint)((ulong)pdVar20 >> 3) & 0x1fffffff) & 7;
        if (uVar17 < 3) {
          uVar23 = uVar17;
        }
        if (uVar17 != 0) goto LAB_006b11eb;
      }
      else {
LAB_006b11eb:
        memcpy(pdVar1 + lVar22,local_d8,(ulong)(uVar23 * 8));
      }
      if (uVar23 < 3) {
        uVar18 = (ulong)(uVar23 << 3);
        memcpy((void *)((long)pdVar1 + lVar22 * 8 + uVar18),local_d8 + uVar18,0x18 - uVar18);
      }
      pCVar15 = local_88;
      lVar22 = lVar22 + 3;
      pdVar20 = pdVar20 + 3;
      psVar24 = psVar24 + 1;
    } while (lVar22 != 0x18);
    uVar18 = (this->StiffnessMatrix).
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols;
    uVar21 = (this->StiffnessMatrix).
             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_rows;
    if ((long)(uVar18 | uVar21) < 0) {
      pcVar19 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, -1, 1>]"
      ;
      goto LAB_006b15e9;
    }
    local_d8._24_8_ =
         ((this->Material).
          super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
         damping_K;
    local_d8._8_8_ = uVar21;
    pPStack_a8 = &local_e8;
    local_d8._32_8_ = local_80;
    local_d8._16_8_ = uVar18;
    if (uVar18 != local_e8.m_storage.m_rows) {
      pcVar19 = 
      "Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>, const Eigen::Matrix<double, -1, -1, 1>>, Eigen::Matrix<double, -1, 1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, -1, 1>>, const Eigen::Matrix<double, -1, -1, 1>>, Rhs = Eigen::Matrix<double, -1, 1>, Option = 0]"
      ;
      goto LAB_006b1608;
    }
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,1,-1,-1>>::
    PlainObjectBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,1,_1,_1>const>const,Eigen::Matrix<double,_1,_1,1,_1,_1>const>,Eigen::Matrix<double,_1,1,0,_1,1>,0>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,1,_1,_1>> *)&local_70,
               (DenseBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_const_Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                *)local_d8);
    if (-1 < local_e8.m_storage.m_rows) {
      peVar6 = (this->Material).
               super___shared_ptr<chrono::fea::ChContinuumElastic,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      uVar18 = local_e8.m_storage.m_rows & 0x7ffffffffffffff8;
      auVar31._8_8_ = 0;
      auVar31._0_8_ =
           this->Volume * (peVar6->super_ChContinuumMaterial).density * 0.125 * peVar6->damping_M;
      if (7 < (ulong)local_e8.m_storage.m_rows) {
        auVar25 = vbroadcastsd_avx512f(auVar31);
        uVar21 = 0;
        do {
          auVar26 = vmulpd_avx512f(auVar25,*(undefined1 (*) [64])
                                            (local_e8.m_storage.m_data + uVar21));
          *(undefined1 (*) [64])(local_e8.m_storage.m_data + uVar21) = auVar26;
          uVar21 = uVar21 + 8;
        } while (uVar21 < uVar18);
      }
      if ((long)uVar18 < local_e8.m_storage.m_rows) {
        auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        auVar26 = vbroadcastsd_avx512f(auVar31);
        uVar21 = 0;
        auVar27 = vpbroadcastq_avx512f();
        do {
          auVar28 = vpbroadcastq_avx512f();
          auVar28 = vporq_avx512f(auVar28,auVar25);
          uVar14 = vpcmpuq_avx512f(auVar28,auVar27,2);
          pdVar1 = local_e8.m_storage.m_data + uVar18 + uVar21;
          auVar28._8_8_ = (ulong)((byte)(uVar14 >> 1) & 1) * (long)pdVar1[1];
          auVar28._0_8_ = (ulong)((byte)uVar14 & 1) * (long)*pdVar1;
          auVar28._16_8_ = (ulong)((byte)(uVar14 >> 2) & 1) * (long)pdVar1[2];
          auVar28._24_8_ = (ulong)((byte)(uVar14 >> 3) & 1) * (long)pdVar1[3];
          auVar28._32_8_ = (ulong)((byte)(uVar14 >> 4) & 1) * (long)pdVar1[4];
          auVar28._40_8_ = (ulong)((byte)(uVar14 >> 5) & 1) * (long)pdVar1[5];
          auVar28._48_8_ = (ulong)((byte)(uVar14 >> 6) & 1) * (long)pdVar1[6];
          auVar28._56_8_ = (uVar14 >> 7) * (long)pdVar1[7];
          auVar28 = vmulpd_avx512f(auVar26,auVar28);
          pdVar1 = local_e8.m_storage.m_data + uVar18 + uVar21;
          bVar7 = (bool)((byte)uVar14 & 1);
          bVar8 = (bool)((byte)(uVar14 >> 1) & 1);
          bVar9 = (bool)((byte)(uVar14 >> 2) & 1);
          bVar10 = (bool)((byte)(uVar14 >> 3) & 1);
          bVar11 = (bool)((byte)(uVar14 >> 4) & 1);
          bVar12 = (bool)((byte)(uVar14 >> 5) & 1);
          bVar13 = (bool)((byte)(uVar14 >> 6) & 1);
          *pdVar1 = (double)((ulong)bVar7 * auVar28._0_8_ | (ulong)!bVar7 * (long)*pdVar1);
          pdVar1[1] = (double)((ulong)bVar8 * auVar28._8_8_ | (ulong)!bVar8 * (long)pdVar1[1]);
          pdVar1[2] = (double)((ulong)bVar9 * auVar28._16_8_ | (ulong)!bVar9 * (long)pdVar1[2]);
          pdVar1[3] = (double)((ulong)bVar10 * auVar28._24_8_ | (ulong)!bVar10 * (long)pdVar1[3]);
          pdVar1[4] = (double)((ulong)bVar11 * auVar28._32_8_ | (ulong)!bVar11 * (long)pdVar1[4]);
          pdVar1[5] = (double)((ulong)bVar12 * auVar28._40_8_ | (ulong)!bVar12 * (long)pdVar1[5]);
          pdVar1[6] = (double)((ulong)bVar13 * auVar28._48_8_ | (ulong)!bVar13 * (long)pdVar1[6]);
          pdVar1[7] = (double)((uVar14 >> 7) * auVar28._56_8_ |
                              (ulong)!SUB81(uVar14 >> 7,0) * (long)pdVar1[7]);
          uVar21 = uVar21 + 8;
        } while ((((uint)local_e8.m_storage.m_rows & 7) + 7 & 0xfffffff8) != uVar21);
      }
      if ((local_68 == local_e8.m_storage.m_rows) && (local_60 == 1)) {
        if (local_e8.m_storage.m_rows == 0) {
          if (local_f8.m_storage.m_rows == 0) goto LAB_006b1415;
        }
        else {
          uVar21 = 0;
          do {
            *(double *)(local_70 + uVar21 * 8) =
                 local_e8.m_storage.m_data[uVar21] + *(double *)(local_70 + uVar21 * 8);
            uVar21 = uVar21 + 1;
          } while (local_e8.m_storage.m_rows != uVar21);
          if (local_f8.m_storage.m_rows == local_e8.m_storage.m_rows) {
            uVar21 = 0;
            do {
              local_f8.m_storage.m_data[uVar21] =
                   *(double *)(local_70 + uVar21 * 8) + local_f8.m_storage.m_data[uVar21];
              uVar21 = uVar21 + 1;
            } while (local_e8.m_storage.m_rows != uVar21);
            if (7 < (ulong)local_e8.m_storage.m_rows) {
              auVar25 = vbroadcastsd_avx512f(ZEXT816(0x8000000000000000));
              uVar21 = 0;
              do {
                auVar26 = vxorpd_avx512dq(auVar25,*(undefined1 (*) [64])
                                                   (local_f8.m_storage.m_data + uVar21));
                *(undefined1 (*) [64])(local_f8.m_storage.m_data + uVar21) = auVar26;
                uVar21 = uVar21 + 8;
              } while (uVar21 < uVar18);
            }
LAB_006b1415:
            if ((long)uVar18 < local_e8.m_storage.m_rows) {
              auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              auVar26 = vbroadcastsd_avx512f(ZEXT816(0x8000000000000000));
              uVar18 = 0;
              auVar27 = vpbroadcastq_avx512f();
              do {
                auVar28 = vpbroadcastq_avx512f();
                auVar28 = vporq_avx512f(auVar28,auVar25);
                uVar21 = vpcmpuq_avx512f(auVar28,auVar27,2);
                pdVar1 = local_f8.m_storage.m_data +
                         ((ulong)local_e8.m_storage.m_rows >> 3) * 8 + uVar18;
                auVar29._8_8_ = (ulong)((byte)(uVar21 >> 1) & 1) * (long)pdVar1[1];
                auVar29._0_8_ = (ulong)((byte)uVar21 & 1) * (long)*pdVar1;
                auVar29._16_8_ = (ulong)((byte)(uVar21 >> 2) & 1) * (long)pdVar1[2];
                auVar29._24_8_ = (ulong)((byte)(uVar21 >> 3) & 1) * (long)pdVar1[3];
                auVar29._32_8_ = (ulong)((byte)(uVar21 >> 4) & 1) * (long)pdVar1[4];
                auVar29._40_8_ = (ulong)((byte)(uVar21 >> 5) & 1) * (long)pdVar1[5];
                auVar29._48_8_ = (ulong)((byte)(uVar21 >> 6) & 1) * (long)pdVar1[6];
                auVar29._56_8_ = (uVar21 >> 7) * (long)pdVar1[7];
                auVar28 = vxorpd_avx512dq(auVar29,auVar26);
                pdVar1 = local_f8.m_storage.m_data +
                         ((ulong)local_e8.m_storage.m_rows >> 3) * 8 + uVar18;
                bVar7 = (bool)((byte)uVar21 & 1);
                bVar8 = (bool)((byte)(uVar21 >> 1) & 1);
                bVar9 = (bool)((byte)(uVar21 >> 2) & 1);
                bVar10 = (bool)((byte)(uVar21 >> 3) & 1);
                bVar11 = (bool)((byte)(uVar21 >> 4) & 1);
                bVar12 = (bool)((byte)(uVar21 >> 5) & 1);
                bVar13 = (bool)((byte)(uVar21 >> 6) & 1);
                *pdVar1 = (double)((ulong)bVar7 * auVar28._0_8_ | (ulong)!bVar7 * (long)*pdVar1);
                pdVar1[1] = (double)((ulong)bVar8 * auVar28._8_8_ | (ulong)!bVar8 * (long)pdVar1[1])
                ;
                pdVar1[2] = (double)((ulong)bVar9 * auVar28._16_8_ | (ulong)!bVar9 * (long)pdVar1[2]
                                    );
                pdVar1[3] = (double)((ulong)bVar10 * auVar28._24_8_ |
                                    (ulong)!bVar10 * (long)pdVar1[3]);
                pdVar1[4] = (double)((ulong)bVar11 * auVar28._32_8_ |
                                    (ulong)!bVar11 * (long)pdVar1[4]);
                pdVar1[5] = (double)((ulong)bVar12 * auVar28._40_8_ |
                                    (ulong)!bVar12 * (long)pdVar1[5]);
                pdVar1[6] = (double)((ulong)bVar13 * auVar28._48_8_ |
                                    (ulong)!bVar13 * (long)pdVar1[6]);
                pdVar1[7] = (double)((uVar21 >> 7) * auVar28._56_8_ |
                                    (ulong)!SUB81(uVar21 >> 7,0) * (long)pdVar1[7]);
                uVar18 = uVar18 + 8;
              } while ((((uint)local_e8.m_storage.m_rows & 7) + 7 & 0xfffffff8) != uVar18);
            }
            local_a0 = 0;
            local_b0 = (double *)0x0;
            pPStack_a8 = (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)0x0;
            local_d8._8_8_ = local_e8.m_storage.m_rows;
            local_d8._0_8_ = local_f8.m_storage.m_data;
            local_d8._16_8_ = 1;
            local_d8._24_8_ = 1;
            local_58.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_data = (pCVar15->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data;
            local_58.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_rows.m_value =
                 (pCVar15->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
                 .m_rows;
            local_58.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value = 1;
            if (local_58.
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_rows.m_value < 0 &&
                local_58.
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_data != (double *)0x0) {
              __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                            ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                            "Eigen::MapBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
                           );
            }
            local_58.
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            .m_stride.m_outer.m_value = 1;
            ChMatrixCorotation::ComputeCK((ChMatrixConstRef)local_d8,local_90,8,&local_58);
            if (local_b0 != (double *)0x0) {
              free((void *)local_b0[-1]);
            }
            if (local_70 != 0) {
              free(*(void **)(local_70 + -8));
            }
            if (local_f8.m_storage.m_data != (double *)0x0) {
              free((void *)local_f8.m_storage.m_data[-1]);
            }
            if (local_e8.m_storage.m_data != (double *)0x0) {
              free((void *)local_e8.m_storage.m_data[-1]);
            }
            return;
          }
        }
        pcVar19 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, -1, 1>, Functor = Eigen::internal::add_assign_op<double, double>]"
        ;
      }
      else {
        pcVar19 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, -1, 1>, SrcXprType = Eigen::Matrix<double, -1, 1>, Functor = Eigen::internal::add_assign_op<double, double>]"
        ;
      }
      __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,pcVar19);
    }
  }
  pcVar19 = 
  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
  ;
LAB_006b15e9:
  __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,pcVar19);
}

Assistant:

void ChElementHexaCorot_8::ComputeInternalForces(ChVectorDynamic<>& Fi) {
    assert(Fi.size() == GetNdofs());

    // set up vector of nodal displacements (in local element system) u_l = R*p - p0
    ChVectorDynamic<> displ(GetNdofs());
    this->GetStateBlock(displ);

    // [local Internal Forces] = [Klocal] * displ + [Rlocal] * displ_dt
    ChVectorDynamic<> FiK_local = StiffnessMatrix * displ;

    for (int in = 0; in < 8; ++in) {
        displ.segment(in * 3, 3) = (A.transpose() * nodes[in]->pos_dt).eigen();  // nodal speeds, local
    }
    ChMatrixDynamic<> FiR_local = Material->Get_RayleighDampingK() * StiffnessMatrix * displ;

    double lumped_node_mass = (this->Volume * this->Material->Get_density()) / 8.0;
    displ *= (lumped_node_mass * Material->Get_RayleighDampingM());
    FiR_local += displ;

    //***TO DO*** better per-node lumping, or 12x12 consistent mass matrix.

    FiK_local += FiR_local;
    FiK_local *= -1.0;

    // Fi = C * Fi_local  with C block-diagonal rotations A
    ChMatrixCorotation::ComputeCK(FiK_local, this->A, 8, Fi);
}